

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O3

float __thiscall DBSCAN::GetDistance(DBSCAN *this,Embedding *emb1,Embedding *emb2)

{
  float *__first;
  float *__first_00;
  double dVar1;
  int *__last;
  long lVar2;
  int *__last_00;
  float fVar3;
  float fVar4;
  float fVar5;
  vector<float,_std::allocator<float>_> tmp;
  vector<float,_std::allocator<float>_> tmp_1;
  allocator_type local_cd;
  float local_cc;
  double local_c8;
  void *local_c0 [2];
  long local_b0;
  undefined8 local_a8;
  float fStack_a0;
  float fStack_9c;
  void *local_90 [2];
  long local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  __first = emb1->emb;
  __last_00 = &emb1->cluster_id;
  __first_00 = emb2->emb;
  __last = &emb2->cluster_id;
  local_a8._0_4_ = 0.0;
  local_a8._4_4_ = 0.0;
  fVar3 = 0.0;
  fVar4 = 0.0;
  fVar5 = 0.0;
  lVar2 = 0;
  do {
    local_cc = fVar5;
    fStack_a0 = fVar3;
    fStack_9c = fVar4;
    std::vector<float,std::allocator<float>>::vector<float*,void>
              ((vector<float,std::allocator<float>> *)local_c0,__first,(float *)__last_00,
               (allocator_type *)local_90);
    local_c8._0_4_ = *(float *)((long)local_c0[0] + lVar2 * 4);
    std::vector<float,std::allocator<float>>::vector<float*,void>
              ((vector<float,std::allocator<float>> *)local_90,__first_00,(float *)__last,&local_cd)
    ;
    local_c8 = (double)CONCAT44(local_c8._4_4_,
                                local_c8._0_4_ * *(float *)((long)local_90[0] + lVar2 * 4));
    operator_delete(local_90[0],local_80 - (long)local_90[0]);
    if (local_c0[0] != (void *)0x0) {
      operator_delete(local_c0[0],local_b0 - (long)local_c0[0]);
    }
    std::vector<float,std::allocator<float>>::vector<float*,void>
              ((vector<float,std::allocator<float>> *)local_c0,__first,(float *)__last_00,
               (allocator_type *)local_90);
    local_48._0_16_ = ZEXT416(*(uint *)((long)local_c0[0] + lVar2 * 4));
    std::vector<float,std::allocator<float>>::vector<float*,void>
              ((vector<float,std::allocator<float>> *)local_90,__first,(float *)__last_00,&local_cd)
    ;
    local_58 = ZEXT416(*(uint *)((long)local_90[0] + lVar2 * 4));
    operator_delete(local_90[0],local_80 - (long)local_90[0]);
    if (local_c0[0] != (void *)0x0) {
      operator_delete(local_c0[0],local_b0 - (long)local_c0[0]);
    }
    std::vector<float,std::allocator<float>>::vector<float*,void>
              ((vector<float,std::allocator<float>> *)local_c0,__first_00,(float *)__last,
               (allocator_type *)local_90);
    local_68 = ZEXT416(*(uint *)((long)local_c0[0] + lVar2 * 4));
    std::vector<float,std::allocator<float>>::vector<float*,void>
              ((vector<float,std::allocator<float>> *)local_90,__first_00,(float *)__last,&local_cd)
    ;
    local_78 = ZEXT416(*(uint *)((long)local_90[0] + lVar2 * 4));
    operator_delete(local_90[0],local_80 - (long)local_90[0]);
    if (local_c0[0] != (void *)0x0) {
      operator_delete(local_c0[0],local_b0 - (long)local_c0[0]);
    }
    fVar5 = local_cc + local_c8._0_4_;
    local_a8._0_4_ = (float)local_a8 + (float)local_58._0_4_ * (float)local_48._0_4_;
    local_a8._4_4_ = local_a8._4_4_ + (float)local_78._0_4_ * (float)local_68._0_4_;
    fVar3 = fStack_a0 + (float)local_58._4_4_ * (float)local_48._4_4_;
    fVar4 = fStack_9c + (float)local_78._4_4_ * (float)local_68._4_4_;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x200);
  dVar1 = (double)(float)local_a8;
  if (dVar1 < 0.0) {
    local_cc = fVar5;
    fStack_a0 = fVar3;
    fStack_9c = fVar4;
    local_c8 = sqrt(dVar1);
    fVar5 = local_cc;
  }
  else {
    local_c8 = SQRT(dVar1);
  }
  dVar1 = (double)local_a8._4_4_;
  local_a8 = (double)fVar5;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  return (float)(local_a8 / (local_c8 * dVar1));
}

Assistant:

float DBSCAN::GetDistance(Embedding emb1, Embedding emb2)
{
    float f1dis = 0;
    float f2dis = 0;
    float f1f2dis = 0;
    for (size_t i = 0; i < EMB_SIZE; i++)
    {
        f1f2dis += (float)emb1.GetEmb()[i] * (float)emb2.GetEmb()[i];
        f1dis += (float)emb1.GetEmb()[i] * (float)emb1.GetEmb()[i];
        f2dis += (float)emb2.GetEmb()[i] * (float)emb2.GetEmb()[i];
    }

    float distance = f1f2dis / (sqrt(f1dis) * sqrt(f2dis));
    return distance;        //开方并返回距离
}